

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O2

int PatchFrame(int frameNum)

{
  char *__s1;
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint statenum;
  size_t sVar4;
  FState *pFVar5;
  uint uVar6;
  spritedef_t *psVar7;
  ulong uVar8;
  uint uVar9;
  uint local_68;
  FState *local_60;
  FState dummy;
  
  local_60 = FindState(frameNum);
  if (local_60 == (FState *)0x0) {
    Printf("Frame %d out of range\n",frameNum);
    local_60 = &dummy;
    local_68 = 0;
    uVar1 = 0;
    uVar2 = 0;
  }
  else {
    local_68 = 4;
    DPrintf(4,"Frame %d\n",frameNum);
    if (frameNum == 0x2f) {
      local_68 = 5;
    }
    else if (frameNum != 0x30) {
      local_68 = FState::GetTics(local_60);
    }
    uVar1 = local_60->Misc1;
    uVar2 = (local_60->StateFlags & 4) << 0xd | (uint)local_60->Frame;
  }
LAB_0037e591:
  uVar9 = uVar2;
  uVar6 = uVar1;
  iVar3 = GetLine();
  if (iVar3 != 1) {
    if (local_60 != &dummy) {
      *(byte *)&local_60->StateFlags = (byte)local_60->StateFlags | 0x40;
      if ((uVar9 & 0x7fc0) != 0) {
        Printf("Frame %d: Subnumber must be in range [0,63]\n",(ulong)(uint)frameNum);
      }
      local_60->Tics = (int16_t)local_68;
      local_60->Misc1 = uVar6;
      local_60->Frame = (byte)uVar9 & 0x3f;
      local_60->StateFlags = (ushort)(uVar9 >> 0xd) & 4 | local_60->StateFlags & 0xfffb;
    }
    return iVar3;
  }
  statenum = atoi(Line2);
  __s1 = Line1;
  sVar4 = strlen(Line1);
  uVar1 = uVar6;
  uVar2 = uVar9;
  switch(sVar4) {
  case 8:
    iVar3 = strcasecmp(__s1,"Duration");
    if (iVar3 != 0) break;
    if (0x7ffe < (int)statenum) {
      statenum = 0x7fff;
    }
    local_68 = statenum;
    if ((int)statenum < 0) {
      local_68 = 0xffffffff;
    }
    goto LAB_0037e591;
  case 9:
    iVar3 = strcasecmp(__s1,"Unknown 1");
    uVar1 = statenum;
    if (iVar3 == 0) goto LAB_0037e591;
    iVar3 = strcasecmp(__s1,"Unknown 2");
    if (iVar3 == 0) {
      local_60->Misc2 = statenum;
      uVar1 = uVar6;
      goto LAB_0037e591;
    }
    break;
  case 10:
    iVar3 = strcasecmp(__s1,"Next frame");
    if (iVar3 == 0) {
      pFVar5 = FindState(statenum);
      local_60->NextState = pFVar5;
      goto LAB_0037e591;
    }
    break;
  case 0xd:
    iVar3 = strcasecmp(__s1,"Sprite number");
    if (iVar3 == 0) {
      if ((int)statenum < (int)OrgSprNames.Count) {
        psVar7 = sprites.Array;
        for (uVar8 = 0; sprites.Count != uVar8; uVar8 = uVar8 + 1) {
          if (*(DWORD *)OrgSprNames.Array[(int)statenum].c == (psVar7->field_0).dwName) {
            local_60->sprite = (uint)uVar8;
            if (sprites.Count != (uint)uVar8) goto LAB_0037e591;
            break;
          }
          psVar7 = psVar7 + 1;
        }
        Printf("Frame %d: Sprite %d (%s) is undefined\n",(ulong)(uint)frameNum,(ulong)statenum);
      }
      else {
        Printf("Frame %d: Sprite %d out of range\n",(ulong)(uint)frameNum,(ulong)statenum);
      }
      goto LAB_0037e591;
    }
    break;
  case 0x10:
    goto switchD_0037e5d8_caseD_10;
  }
switchD_0037e5d8_caseD_b:
  Printf("Unknown key %s encountered in %s %d.\n",__s1,"Frame",(ulong)(uint)frameNum);
  uVar1 = uVar6;
  uVar2 = uVar9;
  goto LAB_0037e591;
switchD_0037e5d8_caseD_10:
  iVar3 = strcasecmp(__s1,"Sprite subnumber");
  uVar2 = statenum;
  if (iVar3 == 0) goto LAB_0037e591;
  goto switchD_0037e5d8_caseD_b;
}

Assistant:

static int PatchFrame (int frameNum)
{
	int result;
	int tics, misc1, frame;
	FState *info, dummy;

	info = FindState (frameNum);
	if (info)
	{
		DPrintf (DMSG_SPAMMY, "Frame %d\n", frameNum);
		if (frameNum == 47)
		{ // Use original tics for S_DSGUNFLASH1
			tics = 5;
		}
		else if (frameNum == 48)
		{ // Ditto for S_DSGUNFLASH2
			tics = 4;
		}
		else
		{
			tics = info->GetTics ();
		}
		misc1 = info->GetMisc1 ();
		frame = info->GetFrame () | (info->GetFullbright() ? 0x8000 : 0);
	}
	else
	{
		info = &dummy;
		tics = misc1 = frame = 0;
		Printf ("Frame %d out of range\n", frameNum);
	}

	while ((result = GetLine ()) == 1)
	{
		int val = atoi (Line2);
		size_t keylen = strlen (Line1);

		if (keylen == 8 && stricmp (Line1, "Duration") == 0)
		{
			tics = clamp (val, -1, SHRT_MAX);
		}
		else if (keylen == 9 && stricmp (Line1, "Unknown 1") == 0)
		{
			misc1 = val;
		}
		else if (keylen == 9 && stricmp (Line1, "Unknown 2") == 0)
		{
			info->Misc2 = val;
		}
		else if (keylen == 13 && stricmp (Line1, "Sprite number") == 0)
		{
			unsigned int i;

			if (val < (int)OrgSprNames.Size())
			{
				for (i = 0; i < sprites.Size(); i++)
				{
					if (memcmp (OrgSprNames[val].c, sprites[i].name, 4) == 0)
					{
						info->sprite = (int)i;
						break;
					}
				}
				if (i == sprites.Size ())
				{
					Printf ("Frame %d: Sprite %d (%s) is undefined\n",
						frameNum, val, OrgSprNames[val].c);
				}
			}
			else
			{
				Printf ("Frame %d: Sprite %d out of range\n", frameNum, val);
			}
		}
		else if (keylen == 10 && stricmp (Line1, "Next frame") == 0)
		{
			info->NextState = FindState (val);
		}
		else if (keylen == 16 && stricmp (Line1, "Sprite subnumber") == 0)
		{
			frame = val;
		}
		else
		{
			Printf (unknown_str, Line1, "Frame", frameNum);
		}
	}

	if (info != &dummy)
	{
		info->StateFlags |= STF_DEHACKED;	// Signals the state has been modified by dehacked
		if ((unsigned)(frame & 0x7fff) > 63)
		{
			Printf("Frame %d: Subnumber must be in range [0,63]\n", frameNum);
		}
		info->Tics = tics;
		info->Misc1 = misc1;
		info->Frame = frame & 0x3f;
		if (frame & 0x8000) info->StateFlags |= STF_FULLBRIGHT;
		else info->StateFlags &= ~STF_FULLBRIGHT;
	}

	return result;
}